

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O0

void dec_update_map_for_intra
               (com_scu_t *map_scu,s8 *map_ipm,int tb_x,int tb_y,int tb_w,int tb_h,int i_scu,int ipm
               )

{
  int local_48;
  int local_44;
  int i;
  int j;
  int iStack_38;
  com_scu_t scu;
  int scup;
  int scu_h;
  int scu_w;
  int scu_y;
  int scu_x;
  int tb_h_local;
  int tb_w_local;
  int tb_y_local;
  int tb_x_local;
  s8 *map_ipm_local;
  com_scu_t *map_scu_local;
  
  iStack_38 = tb_h >> 2;
  j = (tb_y >> 2) * i_scu + (tb_x >> 2);
  memset((void *)((long)&i + 3),0,1);
  _tb_y_local = map_ipm + j;
  map_ipm_local = (s8 *)(map_scu + j);
  for (local_44 = 0; local_44 < iStack_38; local_44 = local_44 + 1) {
    for (local_48 = 0; local_48 < tb_w >> 2; local_48 = local_48 + 1) {
      _tb_y_local[local_48] = (s8)ipm;
      map_ipm_local[local_48] = i._3_1_ & 0xfc | 3;
    }
    _tb_y_local = _tb_y_local + i_scu;
    map_ipm_local = map_ipm_local + i_scu;
  }
  return;
}

Assistant:

void dec_update_map_for_intra(com_scu_t *map_scu, s8 *map_ipm, int tb_x, int tb_y, int tb_w, int tb_h, int i_scu, int ipm)
{
    int scu_x = tb_x >> MIN_CU_LOG2;
    int scu_y = tb_y >> MIN_CU_LOG2;
    int scu_w = tb_w >> MIN_CU_LOG2;
    int scu_h = tb_h >> MIN_CU_LOG2;
    int scup = scu_y * i_scu + scu_x;
    com_scu_t scu = { 0 };
    scu.coded = 1;
    scu.intra = 1;

    map_ipm += scup;
    map_scu += scup;

    for (int j = 0; j < scu_h; j++) {
        for (int i = 0; i < scu_w; i++) {
            map_ipm[i] = ipm;
            map_scu[i] = scu;
        }
        map_ipm += i_scu;
        map_scu += i_scu;
    }
}